

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

uint32_t asmjit::anon_unknown_32::CodeHolder_hashNameAndFixLen(char *name,size_t *nameLength)

{
  uint8_t c_1;
  size_t i_1;
  uint8_t c;
  size_t i;
  uint32_t hVal;
  size_t *nameLength_local;
  char *name_local;
  
  hVal = 0;
  if (*nameLength == 0xffffffffffffffff) {
    for (i = 0; name[i] != 0; i = i + 1) {
      hVal = hVal * 0x1003f + (uint)(byte)name[i];
    }
    *nameLength = i;
  }
  else {
    for (i_1 = 0; i_1 < *nameLength; i_1 = i_1 + 1) {
      if (name[i_1] == 0) {
        return 0x11;
      }
      hVal = hVal * 0x1003f + (uint)(byte)name[i_1];
    }
  }
  return hVal;
}

Assistant:

static uint32_t CodeHolder_hashNameAndFixLen(const char* name, size_t& nameLength) noexcept {
  uint32_t hVal = 0;
  if (nameLength == Globals::kInvalidIndex) {
    size_t i = 0;
    for (;;) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (!c) break;
      hVal = Utils::hashRound(hVal, c);
      i++;
    }
    nameLength = i;
  }
  else {
    for (size_t i = 0; i < nameLength; i++) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hVal = Utils::hashRound(hVal, c);
    }
  }
  return hVal;
}